

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_points_3.h
# Opt level: O3

void draco::
     DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
               (__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                *begin,__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                       *end,QuantizationInfo *info,PointAttributeVectorOutputIterator<float> *oit)

{
  undefined8 uVar1;
  pointer ptVar2;
  PointAttribute *pPVar3;
  size_t __n;
  VectorD<unsigned_int,_3> *pVVar4;
  uint uVar5;
  uint max_quantized_value;
  uint uVar6;
  VectorD<unsigned_int,_3> *pVVar7;
  float fVar8;
  uint uVar9;
  Dequantizer dequantize;
  Dequantizer local_4c;
  float local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  float local_30;
  
  local_48 = info->range;
  max_quantized_value = ~(-1 << ((byte)info->quantization_bits & 0x1f));
  Dequantizer::Dequantizer(&local_4c);
  Dequantizer::Init(&local_4c,local_48,max_quantized_value);
  pVVar7 = begin->_M_current;
  pVVar4 = end->_M_current;
  if (pVVar4 != pVVar7) {
    uVar5 = (oit->point_id_).value_;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar8 = (float)max_quantized_value;
    uVar9 = max_quantized_value;
    local_48 = (float)max_quantized_value;
    uStack_44 = max_quantized_value;
    do {
      local_30 = (float)(int)((pVVar7->v_)._M_elems[2] - max_quantized_value) * local_4c.delta_;
      uVar1 = *(undefined8 *)(pVVar7->v_)._M_elems;
      local_38 = CONCAT44(local_4c.delta_ * (float)(int)((int)((ulong)uVar1 >> 0x20) - uVar9),
                          local_4c.delta_ * (float)((int)uVar1 - (int)fVar8));
      ptVar2 = (oit->attributes_).
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (ptVar2->
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               ).super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      uVar6 = uVar5;
      if (pPVar3->identity_mapping_ == false) {
        uVar6 = *(uint *)(*(long *)&(pPVar3->indices_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                    ._M_impl + (ulong)uVar5 * 4);
      }
      if (uVar6 < pPVar3->num_unique_entries_) {
        __n = (pPVar3->super_GeometryAttribute).byte_stride_;
        memcpy((void *)(uVar6 * __n + *(long *)&((pPVar3->super_GeometryAttribute).buffer_)->data_),
               (void *)((long)&local_38 +
                       (ulong)(ptVar2->
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                              ).
                              super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                              .super__Head_base<1UL,_unsigned_int,_false>._M_head_impl * 4),__n);
        uVar5 = (oit->point_id_).value_;
        pVVar4 = end->_M_current;
        fVar8 = local_48;
        uVar9 = uStack_44;
      }
      uVar5 = uVar5 + 1;
      (oit->point_id_).value_ = uVar5;
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar4);
  }
  return;
}

Assistant:

void DequantizePoints3(const QPointIterator &begin, const QPointIterator &end,
                       const QuantizationInfo &info, OutputIterator &oit) {
  DRACO_DCHECK_GE(info.quantization_bits, 0);
  DRACO_DCHECK_GE(info.range, 0);

  const uint32_t quantization_bits = info.quantization_bits;
  const float range = info.range;
  const uint32_t max_quantized_value((1u << quantization_bits) - 1);
  Dequantizer dequantize;
  dequantize.Init(range, max_quantized_value);

  for (auto it = begin; it != end; ++it) {
    const float x = dequantize((*it)[0] - max_quantized_value);
    const float y = dequantize((*it)[1] - max_quantized_value);
    const float z = dequantize((*it)[2] - max_quantized_value);
    *oit = Point3f(x, y, z);
    ++oit;
  }
}